

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O2

void tty_close(void)

{
  byte bVar1;
  int __fd;
  
  __fd = TTY_Fd;
  if (-1 < TTY_Fd) {
    bVar1 = (byte)TTY_Fd & 0x3f;
    LispReadFds.__fds_bits[(uint)TTY_Fd >> 6] =
         LispReadFds.__fds_bits[(uint)TTY_Fd >> 6] &
         (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
    close(__fd);
    TTY_Fd = -1;
  }
  return;
}

Assistant:

void tty_close(void)
{
  if (TTY_Fd >= 0) {
    FD_CLR(TTY_Fd, &LispReadFds);
    close(TTY_Fd);
#ifdef TTYINT
    int_io_close(TTY_Fd);
#endif
    TTY_Fd = (-1);
  }
}